

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsCliqueTable.cpp
# Opt level: O3

void __thiscall
HighsCliqueTable::queryNeighbourhood
          (HighsCliqueTable *this,vector<int,_std::allocator<int>_> *neighbourhoodInds,
          int64_t *numQueries,CliqueVar v,CliqueVar *q,HighsInt N)

{
  __atomic_base<int> _Var1;
  pointer piVar2;
  iterator __position;
  element_type *peVar3;
  pointer piVar4;
  bool bVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  HighsTask *pHVar28;
  undefined1 auVar29 [16];
  unique_ptr<PaddedData[]> uVar30;
  HighsSplitDeque *pHVar31;
  HighsInt HVar32;
  int iVar33;
  uint uVar34;
  void *pvVar35;
  uint32_t uVar36;
  ulong uVar37;
  uint start;
  long lVar38;
  long lVar39;
  int iVar49;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  int iVar51;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  long lVar50;
  undefined1 auVar52 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 in_XMM11 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  int iVar72;
  undefined1 auVar70 [16];
  int iVar73;
  undefined1 auVar71 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  int iVar87;
  int iVar91;
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  HighsCombinable<ThreadNeighbourhoodQueryData,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_mip_HighsCliqueTable_cpp:455:59)>
  neighbourhoodData;
  HighsCombinable<ThreadNeighbourhoodQueryData,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_mip_HighsCliqueTable_cpp:455:59)>
  local_98;
  anon_class_32_4_8f8caa33 local_88;
  TaskGroup local_68;
  long *local_58;
  long *local_50;
  undefined1 local_48 [16];
  long lVar53;
  
  piVar2 = (neighbourhoodInds->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((neighbourhoodInds->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
      super__Vector_impl_data._M_finish != piVar2) {
    (neighbourhoodInds->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
    super__Vector_impl_data._M_finish = piVar2;
  }
  if ((this->numcliquesvar).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start[(int)((int)v << 1 | (uint)((int)v < 0))] != 0) {
    if ((long)((long)this->numEntries + (this->sizeTwoCliques).numElements * -2) <
        (long)this->minEntriesForParallelism) {
      local_88.this = (HighsCliqueTable *)((ulong)local_88.this & 0xffffffff00000000);
      if (0 < N) {
        iVar33 = 0;
        do {
          if (((((uint)q[iVar33] ^ (uint)v) & 0x7fffffff) != 0) &&
             (HVar32 = findCommonCliqueId(this,numQueries,v,q[iVar33]), HVar32 != -1)) {
            __position._M_current =
                 (neighbourhoodInds->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
            if (__position._M_current ==
                (neighbourhoodInds->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        ((vector<int,std::allocator<int>> *)neighbourhoodInds,__position,
                         (int *)&local_88);
            }
            else {
              *__position._M_current = (int)local_88.this;
              (neighbourhoodInds->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_finish = __position._M_current + 1;
            }
          }
          iVar33 = (int)local_88.this + 1;
          local_88.this = (HighsCliqueTable *)CONCAT44(local_88.this._4_4_,iVar33);
        } while (iVar33 < N);
      }
    }
    else {
      local_98.construct_.N = N;
      local_50 = numQueries;
      HighsTaskExecutor::threadLocalWorkerDequePtr::__tls_init();
      local_58 = (long *)__tls_get_addr(&PTR_00441ef0);
      iVar33 = *(int *)(*local_58 + 0x28);
      lVar38 = (long)iVar33;
      local_98.numThreads = iVar33;
      pvVar35 = operator_new(lVar38 * 0x40 + 0x40);
      uVar37 = (ulong)pvVar35 | 0x3f;
      local_98.threadCopies_._M_t.
      super___uniq_ptr_impl<HighsCombinable<ThreadNeighbourhoodQueryData,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_mip_HighsCliqueTable_cpp:455:59)>::PaddedData,_highs::cache_aligned::Deleter<HighsCombinable<ThreadNeighbourhoodQueryData,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_mip_HighsCliqueTable_cpp:455:59)>::PaddedData[]>_>
      ._M_t.
      super__Tuple_impl<0UL,_HighsCombinable<ThreadNeighbourhoodQueryData,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_mip_HighsCliqueTable_cpp:455:59)>::PaddedData_*,_highs::cache_aligned::Deleter<HighsCombinable<ThreadNeighbourhoodQueryData,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_mip_HighsCliqueTable_cpp:455:59)>::PaddedData[]>_>
      .
      super__Head_base<0UL,_HighsCombinable<ThreadNeighbourhoodQueryData,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_mip_HighsCliqueTable_cpp:455:59)>::PaddedData_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<HighsCombinable<ThreadNeighbourhoodQueryData,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_mip_HighsCliqueTable_cpp:455:59)>::PaddedData,_highs::cache_aligned::Deleter<HighsCombinable<ThreadNeighbourhoodQueryData,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_mip_HighsCliqueTable_cpp:455:59)>::PaddedData[]>,_true,_true>
            )(uVar37 + 1);
      *(void **)(uVar37 - 7) = pvVar35;
      auVar29 = _DAT_003beea0;
      if (0 < lVar38) {
        lVar38 = lVar38 + -1;
        local_48._8_4_ = (int)lVar38;
        local_48._0_8_ = lVar38;
        local_48._12_4_ = (int)((ulong)lVar38 >> 0x20);
        lVar38 = 0;
        auVar40 = local_48;
        auVar52 = _DAT_003cd520;
        auVar54 = _DAT_003cd530;
        auVar55 = _DAT_003cd540;
        auVar56 = _DAT_003cd550;
        auVar57 = _DAT_003cd560;
        auVar58 = _DAT_003cd570;
        auVar59 = _DAT_003bf640;
        auVar60 = _DAT_003bee90;
        do {
          auVar70 = local_48 ^ auVar29;
          auVar74 = auVar60 ^ auVar29;
          iVar49 = auVar70._0_4_;
          iVar87 = -(uint)(iVar49 < auVar74._0_4_);
          iVar51 = auVar70._4_4_;
          auVar76._4_4_ = -(uint)(iVar51 < auVar74._4_4_);
          iVar72 = auVar70._8_4_;
          iVar91 = -(uint)(iVar72 < auVar74._8_4_);
          iVar73 = auVar70._12_4_;
          auVar76._12_4_ = -(uint)(iVar73 < auVar74._12_4_);
          auVar70._4_4_ = iVar87;
          auVar70._0_4_ = iVar87;
          auVar70._8_4_ = iVar91;
          auVar70._12_4_ = iVar91;
          auVar70 = pshuflw(auVar40,auVar70,0xe8);
          auVar75._4_4_ = -(uint)(auVar74._4_4_ == iVar51);
          auVar75._12_4_ = -(uint)(auVar74._12_4_ == iVar73);
          auVar75._0_4_ = auVar75._4_4_;
          auVar75._8_4_ = auVar75._12_4_;
          auVar61 = pshuflw(in_XMM11,auVar75,0xe8);
          auVar76._0_4_ = auVar76._4_4_;
          auVar76._8_4_ = auVar76._12_4_;
          auVar74 = pshuflw(auVar70,auVar76,0xe8);
          auVar40._8_4_ = 0xffffffff;
          auVar40._0_8_ = 0xffffffffffffffff;
          auVar40._12_4_ = 0xffffffff;
          auVar40 = (auVar74 | auVar61 & auVar70) ^ auVar40;
          auVar40 = packssdw(auVar40,auVar40);
          if ((auVar40 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            *(undefined1 *)
             ((long)local_98.threadCopies_._M_t.
                    super___uniq_ptr_impl<HighsCombinable<ThreadNeighbourhoodQueryData,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_mip_HighsCliqueTable_cpp:455:59)>::PaddedData,_highs::cache_aligned::Deleter<HighsCombinable<ThreadNeighbourhoodQueryData,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_mip_HighsCliqueTable_cpp:455:59)>::PaddedData[]>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_HighsCombinable<ThreadNeighbourhoodQueryData,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_mip_HighsCliqueTable_cpp:455:59)>::PaddedData_*,_highs::cache_aligned::Deleter<HighsCombinable<ThreadNeighbourhoodQueryData,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_mip_HighsCliqueTable_cpp:455:59)>::PaddedData[]>_>
                    .
                    super__Head_base<0UL,_HighsCombinable<ThreadNeighbourhoodQueryData,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_mip_HighsCliqueTable_cpp:455:59)>::PaddedData_*,_false>
                    ._M_head_impl + lVar38) = 0;
          }
          auVar61._4_4_ = iVar87;
          auVar61._0_4_ = iVar87;
          auVar61._8_4_ = iVar91;
          auVar61._12_4_ = iVar91;
          auVar76 = auVar75 & auVar61 | auVar76;
          auVar40 = packssdw(auVar76,auVar76);
          auVar74._8_4_ = 0xffffffff;
          auVar74._0_8_ = 0xffffffffffffffff;
          auVar74._12_4_ = 0xffffffff;
          auVar40 = packssdw(auVar40 ^ auVar74,auVar40 ^ auVar74);
          auVar40 = packsswb(auVar40,auVar40);
          if ((auVar40._0_4_ >> 8 & 1) != 0) {
            *(undefined1 *)(uVar37 + 0x41 + lVar38) = 0;
          }
          auVar40 = auVar59 ^ auVar29;
          auVar62._0_4_ = -(uint)(iVar49 < auVar40._0_4_);
          auVar62._4_4_ = -(uint)(iVar51 < auVar40._4_4_);
          auVar62._8_4_ = -(uint)(iVar72 < auVar40._8_4_);
          auVar62._12_4_ = -(uint)(iVar73 < auVar40._12_4_);
          auVar77._4_4_ = auVar62._0_4_;
          auVar77._0_4_ = auVar62._0_4_;
          auVar77._8_4_ = auVar62._8_4_;
          auVar77._12_4_ = auVar62._8_4_;
          iVar87 = -(uint)(auVar40._4_4_ == iVar51);
          iVar91 = -(uint)(auVar40._12_4_ == iVar73);
          auVar15._4_4_ = iVar87;
          auVar15._0_4_ = iVar87;
          auVar15._8_4_ = iVar91;
          auVar15._12_4_ = iVar91;
          auVar88._4_4_ = auVar62._4_4_;
          auVar88._0_4_ = auVar62._4_4_;
          auVar88._8_4_ = auVar62._12_4_;
          auVar88._12_4_ = auVar62._12_4_;
          auVar40 = auVar15 & auVar77 | auVar88;
          auVar40 = packssdw(auVar40,auVar40);
          auVar6._8_4_ = 0xffffffff;
          auVar6._0_8_ = 0xffffffffffffffff;
          auVar6._12_4_ = 0xffffffff;
          auVar40 = packssdw(auVar40 ^ auVar6,auVar40 ^ auVar6);
          auVar40 = packsswb(auVar40,auVar40);
          if ((auVar40._0_4_ >> 0x10 & 1) != 0) {
            *(undefined1 *)(uVar37 + 0x81 + lVar38) = 0;
          }
          auVar40 = pshufhw(auVar40,auVar77,0x84);
          auVar16._4_4_ = iVar87;
          auVar16._0_4_ = iVar87;
          auVar16._8_4_ = iVar91;
          auVar16._12_4_ = iVar91;
          auVar74 = pshufhw(auVar62,auVar16,0x84);
          auVar70 = pshufhw(auVar40,auVar88,0x84);
          auVar41._8_4_ = 0xffffffff;
          auVar41._0_8_ = 0xffffffffffffffff;
          auVar41._12_4_ = 0xffffffff;
          auVar41 = (auVar70 | auVar74 & auVar40) ^ auVar41;
          auVar40 = packssdw(auVar41,auVar41);
          auVar40 = packsswb(auVar40,auVar40);
          if ((auVar40._0_4_ >> 0x18 & 1) != 0) {
            *(undefined1 *)(uVar37 + 0xc1 + lVar38) = 0;
          }
          auVar40 = auVar58 ^ auVar29;
          auVar63._0_4_ = -(uint)(iVar49 < auVar40._0_4_);
          auVar63._4_4_ = -(uint)(iVar51 < auVar40._4_4_);
          auVar63._8_4_ = -(uint)(iVar72 < auVar40._8_4_);
          auVar63._12_4_ = -(uint)(iVar73 < auVar40._12_4_);
          auVar17._4_4_ = auVar63._0_4_;
          auVar17._0_4_ = auVar63._0_4_;
          auVar17._8_4_ = auVar63._8_4_;
          auVar17._12_4_ = auVar63._8_4_;
          auVar74 = pshuflw(auVar88,auVar17,0xe8);
          auVar42._0_4_ = -(uint)(auVar40._0_4_ == iVar49);
          auVar42._4_4_ = -(uint)(auVar40._4_4_ == iVar51);
          auVar42._8_4_ = -(uint)(auVar40._8_4_ == iVar72);
          auVar42._12_4_ = -(uint)(auVar40._12_4_ == iVar73);
          auVar78._4_4_ = auVar42._4_4_;
          auVar78._0_4_ = auVar42._4_4_;
          auVar78._8_4_ = auVar42._12_4_;
          auVar78._12_4_ = auVar42._12_4_;
          auVar40 = pshuflw(auVar42,auVar78,0xe8);
          auVar79._4_4_ = auVar63._4_4_;
          auVar79._0_4_ = auVar63._4_4_;
          auVar79._8_4_ = auVar63._12_4_;
          auVar79._12_4_ = auVar63._12_4_;
          auVar70 = pshuflw(auVar63,auVar79,0xe8);
          auVar7._8_4_ = 0xffffffff;
          auVar7._0_8_ = 0xffffffffffffffff;
          auVar7._12_4_ = 0xffffffff;
          auVar40 = packssdw(auVar40 & auVar74,(auVar70 | auVar40 & auVar74) ^ auVar7);
          auVar40 = packsswb(auVar40,auVar40);
          if ((auVar40 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            *(undefined1 *)(uVar37 + 0x101 + lVar38) = 0;
          }
          auVar18._4_4_ = auVar63._0_4_;
          auVar18._0_4_ = auVar63._0_4_;
          auVar18._8_4_ = auVar63._8_4_;
          auVar18._12_4_ = auVar63._8_4_;
          auVar79 = auVar78 & auVar18 | auVar79;
          auVar70 = packssdw(auVar79,auVar79);
          auVar8._8_4_ = 0xffffffff;
          auVar8._0_8_ = 0xffffffffffffffff;
          auVar8._12_4_ = 0xffffffff;
          auVar40 = packssdw(auVar40,auVar70 ^ auVar8);
          auVar40 = packsswb(auVar40,auVar40);
          if ((auVar40._4_2_ >> 8 & 1) != 0) {
            *(undefined1 *)(uVar37 + 0x141 + lVar38) = 0;
          }
          auVar40 = auVar57 ^ auVar29;
          auVar64._0_4_ = -(uint)(iVar49 < auVar40._0_4_);
          auVar64._4_4_ = -(uint)(iVar51 < auVar40._4_4_);
          auVar64._8_4_ = -(uint)(iVar72 < auVar40._8_4_);
          auVar64._12_4_ = -(uint)(iVar73 < auVar40._12_4_);
          auVar80._4_4_ = auVar64._0_4_;
          auVar80._0_4_ = auVar64._0_4_;
          auVar80._8_4_ = auVar64._8_4_;
          auVar80._12_4_ = auVar64._8_4_;
          iVar87 = -(uint)(auVar40._4_4_ == iVar51);
          iVar91 = -(uint)(auVar40._12_4_ == iVar73);
          auVar19._4_4_ = iVar87;
          auVar19._0_4_ = iVar87;
          auVar19._8_4_ = iVar91;
          auVar19._12_4_ = iVar91;
          auVar89._4_4_ = auVar64._4_4_;
          auVar89._0_4_ = auVar64._4_4_;
          auVar89._8_4_ = auVar64._12_4_;
          auVar89._12_4_ = auVar64._12_4_;
          auVar40 = auVar19 & auVar80 | auVar89;
          auVar40 = packssdw(auVar40,auVar40);
          auVar9._8_4_ = 0xffffffff;
          auVar9._0_8_ = 0xffffffffffffffff;
          auVar9._12_4_ = 0xffffffff;
          auVar40 = packssdw(auVar40 ^ auVar9,auVar40 ^ auVar9);
          auVar40 = packsswb(auVar40,auVar40);
          if ((auVar40 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            *(undefined1 *)(uVar37 + 0x181 + lVar38) = 0;
          }
          auVar40 = pshufhw(auVar40,auVar80,0x84);
          auVar20._4_4_ = iVar87;
          auVar20._0_4_ = iVar87;
          auVar20._8_4_ = iVar91;
          auVar20._12_4_ = iVar91;
          auVar74 = pshufhw(auVar64,auVar20,0x84);
          auVar70 = pshufhw(auVar40,auVar89,0x84);
          auVar43._8_4_ = 0xffffffff;
          auVar43._0_8_ = 0xffffffffffffffff;
          auVar43._12_4_ = 0xffffffff;
          auVar43 = (auVar70 | auVar74 & auVar40) ^ auVar43;
          auVar40 = packssdw(auVar43,auVar43);
          auVar40 = packsswb(auVar40,auVar40);
          if ((auVar40._6_2_ >> 8 & 1) != 0) {
            *(undefined1 *)(uVar37 + 0x1c1 + lVar38) = 0;
          }
          auVar40 = auVar56 ^ auVar29;
          auVar65._0_4_ = -(uint)(iVar49 < auVar40._0_4_);
          auVar65._4_4_ = -(uint)(iVar51 < auVar40._4_4_);
          auVar65._8_4_ = -(uint)(iVar72 < auVar40._8_4_);
          auVar65._12_4_ = -(uint)(iVar73 < auVar40._12_4_);
          auVar21._4_4_ = auVar65._0_4_;
          auVar21._0_4_ = auVar65._0_4_;
          auVar21._8_4_ = auVar65._8_4_;
          auVar21._12_4_ = auVar65._8_4_;
          auVar74 = pshuflw(auVar89,auVar21,0xe8);
          auVar44._0_4_ = -(uint)(auVar40._0_4_ == iVar49);
          auVar44._4_4_ = -(uint)(auVar40._4_4_ == iVar51);
          auVar44._8_4_ = -(uint)(auVar40._8_4_ == iVar72);
          auVar44._12_4_ = -(uint)(auVar40._12_4_ == iVar73);
          auVar81._4_4_ = auVar44._4_4_;
          auVar81._0_4_ = auVar44._4_4_;
          auVar81._8_4_ = auVar44._12_4_;
          auVar81._12_4_ = auVar44._12_4_;
          auVar40 = pshuflw(auVar44,auVar81,0xe8);
          auVar82._4_4_ = auVar65._4_4_;
          auVar82._0_4_ = auVar65._4_4_;
          auVar82._8_4_ = auVar65._12_4_;
          auVar82._12_4_ = auVar65._12_4_;
          auVar70 = pshuflw(auVar65,auVar82,0xe8);
          auVar66._8_4_ = 0xffffffff;
          auVar66._0_8_ = 0xffffffffffffffff;
          auVar66._12_4_ = 0xffffffff;
          auVar66 = (auVar70 | auVar40 & auVar74) ^ auVar66;
          auVar70 = packssdw(auVar66,auVar66);
          auVar40 = packsswb(auVar40 & auVar74,auVar70);
          if ((auVar40 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            *(undefined1 *)(uVar37 + 0x201 + lVar38) = 0;
          }
          auVar22._4_4_ = auVar65._0_4_;
          auVar22._0_4_ = auVar65._0_4_;
          auVar22._8_4_ = auVar65._8_4_;
          auVar22._12_4_ = auVar65._8_4_;
          auVar82 = auVar81 & auVar22 | auVar82;
          auVar70 = packssdw(auVar82,auVar82);
          auVar10._8_4_ = 0xffffffff;
          auVar10._0_8_ = 0xffffffffffffffff;
          auVar10._12_4_ = 0xffffffff;
          auVar70 = packssdw(auVar70 ^ auVar10,auVar70 ^ auVar10);
          auVar40 = packsswb(auVar40,auVar70);
          if ((auVar40._8_2_ >> 8 & 1) != 0) {
            *(undefined1 *)(uVar37 + 0x241 + lVar38) = 0;
          }
          auVar40 = auVar55 ^ auVar29;
          auVar67._0_4_ = -(uint)(iVar49 < auVar40._0_4_);
          auVar67._4_4_ = -(uint)(iVar51 < auVar40._4_4_);
          auVar67._8_4_ = -(uint)(iVar72 < auVar40._8_4_);
          auVar67._12_4_ = -(uint)(iVar73 < auVar40._12_4_);
          auVar83._4_4_ = auVar67._0_4_;
          auVar83._0_4_ = auVar67._0_4_;
          auVar83._8_4_ = auVar67._8_4_;
          auVar83._12_4_ = auVar67._8_4_;
          iVar87 = -(uint)(auVar40._4_4_ == iVar51);
          iVar91 = -(uint)(auVar40._12_4_ == iVar73);
          auVar23._4_4_ = iVar87;
          auVar23._0_4_ = iVar87;
          auVar23._8_4_ = iVar91;
          auVar23._12_4_ = iVar91;
          auVar90._4_4_ = auVar67._4_4_;
          auVar90._0_4_ = auVar67._4_4_;
          auVar90._8_4_ = auVar67._12_4_;
          auVar90._12_4_ = auVar67._12_4_;
          auVar40 = auVar23 & auVar83 | auVar90;
          auVar40 = packssdw(auVar40,auVar40);
          auVar11._8_4_ = 0xffffffff;
          auVar11._0_8_ = 0xffffffffffffffff;
          auVar11._12_4_ = 0xffffffff;
          auVar40 = packssdw(auVar40 ^ auVar11,auVar40 ^ auVar11);
          auVar40 = packsswb(auVar40,auVar40);
          if ((auVar40 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
            *(undefined1 *)(uVar37 + 0x281 + lVar38) = 0;
          }
          auVar40 = pshufhw(auVar40,auVar83,0x84);
          auVar24._4_4_ = iVar87;
          auVar24._0_4_ = iVar87;
          auVar24._8_4_ = iVar91;
          auVar24._12_4_ = iVar91;
          auVar74 = pshufhw(auVar67,auVar24,0x84);
          auVar70 = pshufhw(auVar40,auVar90,0x84);
          auVar45._8_4_ = 0xffffffff;
          auVar45._0_8_ = 0xffffffffffffffff;
          auVar45._12_4_ = 0xffffffff;
          auVar45 = (auVar70 | auVar74 & auVar40) ^ auVar45;
          auVar40 = packssdw(auVar45,auVar45);
          auVar40 = packsswb(auVar40,auVar40);
          if ((auVar40._10_2_ >> 8 & 1) != 0) {
            *(undefined1 *)(uVar37 + 0x2c1 + lVar38) = 0;
          }
          auVar40 = auVar54 ^ auVar29;
          auVar68._0_4_ = -(uint)(iVar49 < auVar40._0_4_);
          auVar68._4_4_ = -(uint)(iVar51 < auVar40._4_4_);
          auVar68._8_4_ = -(uint)(iVar72 < auVar40._8_4_);
          auVar68._12_4_ = -(uint)(iVar73 < auVar40._12_4_);
          auVar25._4_4_ = auVar68._0_4_;
          auVar25._0_4_ = auVar68._0_4_;
          auVar25._8_4_ = auVar68._8_4_;
          auVar25._12_4_ = auVar68._8_4_;
          auVar74 = pshuflw(auVar90,auVar25,0xe8);
          auVar46._0_4_ = -(uint)(auVar40._0_4_ == iVar49);
          auVar46._4_4_ = -(uint)(auVar40._4_4_ == iVar51);
          auVar46._8_4_ = -(uint)(auVar40._8_4_ == iVar72);
          auVar46._12_4_ = -(uint)(auVar40._12_4_ == iVar73);
          auVar84._4_4_ = auVar46._4_4_;
          auVar84._0_4_ = auVar46._4_4_;
          auVar84._8_4_ = auVar46._12_4_;
          auVar84._12_4_ = auVar46._12_4_;
          auVar40 = pshuflw(auVar46,auVar84,0xe8);
          auVar85._4_4_ = auVar68._4_4_;
          auVar85._0_4_ = auVar68._4_4_;
          auVar85._8_4_ = auVar68._12_4_;
          auVar85._12_4_ = auVar68._12_4_;
          auVar70 = pshuflw(auVar68,auVar85,0xe8);
          auVar12._8_4_ = 0xffffffff;
          auVar12._0_8_ = 0xffffffffffffffff;
          auVar12._12_4_ = 0xffffffff;
          auVar40 = packssdw(auVar40 & auVar74,(auVar70 | auVar40 & auVar74) ^ auVar12);
          auVar40 = packsswb(auVar40,auVar40);
          if ((auVar40 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            *(undefined1 *)(uVar37 + 0x301 + lVar38) = 0;
          }
          auVar26._4_4_ = auVar68._0_4_;
          auVar26._0_4_ = auVar68._0_4_;
          auVar26._8_4_ = auVar68._8_4_;
          auVar26._12_4_ = auVar68._8_4_;
          auVar85 = auVar84 & auVar26 | auVar85;
          auVar70 = packssdw(auVar85,auVar85);
          auVar13._8_4_ = 0xffffffff;
          auVar13._0_8_ = 0xffffffffffffffff;
          auVar13._12_4_ = 0xffffffff;
          auVar40 = packssdw(auVar40,auVar70 ^ auVar13);
          auVar40 = packsswb(auVar40,auVar40);
          if ((auVar40._12_2_ >> 8 & 1) != 0) {
            *(undefined1 *)(uVar37 + 0x341 + lVar38) = 0;
          }
          auVar40 = auVar52 ^ auVar29;
          auVar69._0_4_ = -(uint)(iVar49 < auVar40._0_4_);
          auVar69._4_4_ = -(uint)(iVar51 < auVar40._4_4_);
          auVar69._8_4_ = -(uint)(iVar72 < auVar40._8_4_);
          auVar69._12_4_ = -(uint)(iVar73 < auVar40._12_4_);
          auVar86._4_4_ = auVar69._0_4_;
          auVar86._0_4_ = auVar69._0_4_;
          auVar86._8_4_ = auVar69._8_4_;
          auVar86._12_4_ = auVar69._8_4_;
          iVar49 = -(uint)(auVar40._4_4_ == iVar51);
          iVar51 = -(uint)(auVar40._12_4_ == iVar73);
          auVar71._4_4_ = iVar49;
          auVar71._0_4_ = iVar49;
          auVar71._8_4_ = iVar51;
          auVar71._12_4_ = iVar51;
          auVar47._4_4_ = auVar69._4_4_;
          auVar47._0_4_ = auVar69._4_4_;
          auVar47._8_4_ = auVar69._12_4_;
          auVar47._12_4_ = auVar69._12_4_;
          auVar47 = auVar71 & auVar86 | auVar47;
          auVar40 = packssdw(auVar47,auVar47);
          auVar14._8_4_ = 0xffffffff;
          auVar14._0_8_ = 0xffffffffffffffff;
          auVar14._12_4_ = 0xffffffff;
          auVar40 = packssdw(auVar40 ^ auVar14,auVar40 ^ auVar14);
          auVar40 = packsswb(auVar40,auVar40);
          if ((auVar40 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            *(undefined1 *)(uVar37 + 0x381 + lVar38) = 0;
          }
          auVar40 = pshufhw(auVar40,auVar86,0x84);
          in_XMM11 = pshufhw(auVar69,auVar71,0x84);
          in_XMM11 = in_XMM11 & auVar40;
          auVar27._4_4_ = auVar69._4_4_;
          auVar27._0_4_ = auVar69._4_4_;
          auVar27._8_4_ = auVar69._12_4_;
          auVar27._12_4_ = auVar69._12_4_;
          auVar40 = pshufhw(auVar40,auVar27,0x84);
          auVar48._8_4_ = 0xffffffff;
          auVar48._0_8_ = 0xffffffffffffffff;
          auVar48._12_4_ = 0xffffffff;
          auVar48 = (auVar40 | in_XMM11) ^ auVar48;
          auVar40 = packssdw(auVar48,auVar48);
          auVar40 = packsswb(auVar40,auVar40);
          if ((auVar40._14_2_ >> 8 & 1) != 0) {
            *(undefined1 *)(uVar37 + 0x3c1 + lVar38) = 0;
          }
          lVar39 = (long)DAT_003cd580;
          lVar53 = auVar60._8_8_;
          auVar60._0_8_ = auVar60._0_8_ + lVar39;
          lVar50 = DAT_003cd580._8_8_;
          auVar60._8_8_ = lVar53 + lVar50;
          lVar53 = auVar59._8_8_;
          auVar59._0_8_ = auVar59._0_8_ + lVar39;
          auVar59._8_8_ = lVar53 + lVar50;
          lVar53 = auVar58._8_8_;
          auVar58._0_8_ = auVar58._0_8_ + lVar39;
          auVar58._8_8_ = lVar53 + lVar50;
          lVar53 = auVar57._8_8_;
          auVar57._0_8_ = auVar57._0_8_ + lVar39;
          auVar57._8_8_ = lVar53 + lVar50;
          lVar53 = auVar56._8_8_;
          auVar56._0_8_ = auVar56._0_8_ + lVar39;
          auVar56._8_8_ = lVar53 + lVar50;
          lVar53 = auVar55._8_8_;
          auVar55._0_8_ = auVar55._0_8_ + lVar39;
          auVar55._8_8_ = lVar53 + lVar50;
          lVar53 = auVar54._8_8_;
          auVar54._0_8_ = auVar54._0_8_ + lVar39;
          auVar54._8_8_ = lVar53 + lVar50;
          lVar53 = auVar52._8_8_;
          auVar52._0_8_ = auVar52._0_8_ + lVar39;
          auVar52._8_8_ = lVar53 + lVar50;
          lVar38 = lVar38 + 0x400;
          auVar40 = _DAT_003cd580;
        } while ((ulong)(iVar33 + 0xfU >> 4) << 10 != lVar38);
      }
      local_88.this = this;
      local_88.v = v;
      local_88.q = q;
      if (N < 0xb) {
        local_88.neighbourhoodData = &local_98;
        queryNeighbourhood::anon_class_32_4_8f8caa33::operator()(&local_88,0,N);
      }
      else {
        local_88.neighbourhoodData = &local_98;
        HighsTaskExecutor::threadLocalWorkerDequePtr::__tls_init();
        local_68.workerDeque = (HighsSplitDeque *)*local_58;
        local_68.dequeHead = ((local_68.workerDeque)->ownerData).head;
        do {
          pHVar31 = local_68.workerDeque;
          start = (uint)N >> 1;
          uVar34 = ((local_68.workerDeque)->ownerData).head;
          uVar37 = (ulong)uVar34;
          if (uVar37 < 0x2000) {
            uVar36 = (uint32_t)(uVar37 + 1);
            ((local_68.workerDeque)->ownerData).head = uVar36;
            ((local_68.workerDeque)->taskArray)._M_elems[uVar37].metadata.stealer.
            super___atomic_base<unsigned_long>._M_i = 0;
            *(undefined ***)((local_68.workerDeque)->taskArray)._M_elems[uVar37].taskData =
                 &PTR_operator___00440f70;
            *(uint *)(((local_68.workerDeque)->taskArray)._M_elems[uVar37].taskData + 8) = start;
            *(HighsInt *)(((local_68.workerDeque)->taskArray)._M_elems[uVar37].taskData + 0xc) = N;
            pHVar28 = ((local_68.workerDeque)->taskArray)._M_elems + uVar37;
            pHVar28->taskData[0x10] = '\n';
            pHVar28->taskData[0x11] = '\0';
            pHVar28->taskData[0x12] = '\0';
            pHVar28->taskData[0x13] = '\0';
            *(anon_class_32_4_8f8caa33 **)
             (((local_68.workerDeque)->taskArray)._M_elems[uVar37].taskData + 0x18) = &local_88;
            if (((local_68.workerDeque)->ownerData).allStolenCopy == true) {
              ((local_68.workerDeque)->stealerData).ts.super___atomic_base<unsigned_long>._M_i =
                   uVar37 << 0x20 | uVar37 + 1;
              ((local_68.workerDeque)->stealerData).allStolen._M_base._M_i = false;
              ((local_68.workerDeque)->ownerData).splitCopy = uVar36;
              ((local_68.workerDeque)->ownerData).allStolenCopy = false;
              if ((((local_68.workerDeque)->splitRequest)._M_base._M_i & 1U) != 0) {
                ((local_68.workerDeque)->splitRequest)._M_base._M_i = false;
              }
              peVar3 = ((local_68.workerDeque)->ownerData).workerBunk.
                       super___shared_ptr<HighsSplitDeque::WorkerBunk,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr;
              LOCK();
              _Var1._M_i = (peVar3->haveJobs).super___atomic_base<int>._M_i;
              (peVar3->haveJobs).super___atomic_base<int>._M_i =
                   (peVar3->haveJobs).super___atomic_base<int>._M_i + 1;
              UNLOCK();
              if (_Var1._M_i < ((local_68.workerDeque)->ownerData).numWorkers + -1) {
                HighsSplitDeque::WorkerBunk::publishWork
                          (((local_68.workerDeque)->ownerData).workerBunk.
                           super___shared_ptr<HighsSplitDeque::WorkerBunk,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr,local_68.workerDeque);
              }
            }
            else {
              HighsSplitDeque::growShared(local_68.workerDeque);
            }
          }
          else {
            if ((((local_68.workerDeque)->ownerData).splitCopy < 0x2000) &&
               (((local_68.workerDeque)->ownerData).allStolenCopy == false)) {
              HighsSplitDeque::growShared(local_68.workerDeque);
              uVar34 = (pHVar31->ownerData).head;
            }
            (pHVar31->ownerData).head = uVar34 + 1;
            ::highs::parallel::
            for_each<HighsCliqueTable::queryNeighbourhood(std::vector<int,std::allocator<int>>&,long&,HighsCliqueTable::CliqueVar,HighsCliqueTable::CliqueVar*,int)const::__1&>
                      (start,N,&local_88,10);
          }
          bVar5 = 0x15 < (uint)N;
          N = start;
        } while (bVar5);
        queryNeighbourhood::anon_class_32_4_8f8caa33::operator()(&local_88,0,start);
        ::highs::parallel::TaskGroup::taskWait(&local_68);
        ::highs::parallel::TaskGroup::~TaskGroup(&local_68);
      }
      if (0 < local_98.numThreads) {
        lVar38 = 0x18;
        lVar39 = 0;
        iVar33 = local_98.numThreads;
        do {
          uVar30._M_t.
          super___uniq_ptr_impl<HighsCombinable<ThreadNeighbourhoodQueryData,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_mip_HighsCliqueTable_cpp:455:59)>::PaddedData,_highs::cache_aligned::Deleter<HighsCombinable<ThreadNeighbourhoodQueryData,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_mip_HighsCliqueTable_cpp:455:59)>::PaddedData[]>_>
          ._M_t.
          super__Tuple_impl<0UL,_HighsCombinable<ThreadNeighbourhoodQueryData,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_mip_HighsCliqueTable_cpp:455:59)>::PaddedData_*,_highs::cache_aligned::Deleter<HighsCombinable<ThreadNeighbourhoodQueryData,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_mip_HighsCliqueTable_cpp:455:59)>::PaddedData[]>_>
          .
          super__Head_base<0UL,_HighsCombinable<ThreadNeighbourhoodQueryData,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_mip_HighsCliqueTable_cpp:455:59)>::PaddedData_*,_false>
          ._M_head_impl =
               local_98.threadCopies_._M_t.
               super___uniq_ptr_impl<HighsCombinable<ThreadNeighbourhoodQueryData,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_mip_HighsCliqueTable_cpp:455:59)>::PaddedData,_highs::cache_aligned::Deleter<HighsCombinable<ThreadNeighbourhoodQueryData,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_mip_HighsCliqueTable_cpp:455:59)>::PaddedData[]>_>
               ._M_t.
               super__Tuple_impl<0UL,_HighsCombinable<ThreadNeighbourhoodQueryData,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_mip_HighsCliqueTable_cpp:455:59)>::PaddedData_*,_highs::cache_aligned::Deleter<HighsCombinable<ThreadNeighbourhoodQueryData,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_mip_HighsCliqueTable_cpp:455:59)>::PaddedData[]>_>
               .
               super__Head_base<0UL,_HighsCombinable<ThreadNeighbourhoodQueryData,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_mip_HighsCliqueTable_cpp:455:59)>::PaddedData_*,_false>
               ._M_head_impl;
          if (*(char *)((long)local_98.threadCopies_._M_t.
                              super___uniq_ptr_impl<HighsCombinable<ThreadNeighbourhoodQueryData,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_mip_HighsCliqueTable_cpp:455:59)>::PaddedData,_highs::cache_aligned::Deleter<HighsCombinable<ThreadNeighbourhoodQueryData,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_mip_HighsCliqueTable_cpp:455:59)>::PaddedData[]>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_HighsCombinable<ThreadNeighbourhoodQueryData,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_mip_HighsCliqueTable_cpp:455:59)>::PaddedData_*,_highs::cache_aligned::Deleter<HighsCombinable<ThreadNeighbourhoodQueryData,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_mip_HighsCliqueTable_cpp:455:59)>::PaddedData[]>_>
                              .
                              super__Head_base<0UL,_HighsCombinable<ThreadNeighbourhoodQueryData,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_mip_HighsCliqueTable_cpp:455:59)>::PaddedData_*,_false>
                              ._M_head_impl + -0x18 + lVar38) == '\x01') {
            std::vector<int,std::allocator<int>>::
            _M_range_insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                      ((vector<int,std::allocator<int>> *)neighbourhoodInds,
                       (neighbourhoodInds->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_finish,
                       *(undefined8 *)
                        ((long)local_98.threadCopies_._M_t.
                               super___uniq_ptr_impl<HighsCombinable<ThreadNeighbourhoodQueryData,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_mip_HighsCliqueTable_cpp:455:59)>::PaddedData,_highs::cache_aligned::Deleter<HighsCombinable<ThreadNeighbourhoodQueryData,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_mip_HighsCliqueTable_cpp:455:59)>::PaddedData[]>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_HighsCombinable<ThreadNeighbourhoodQueryData,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_mip_HighsCliqueTable_cpp:455:59)>::PaddedData_*,_highs::cache_aligned::Deleter<HighsCombinable<ThreadNeighbourhoodQueryData,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_mip_HighsCliqueTable_cpp:455:59)>::PaddedData[]>_>
                               .
                               super__Head_base<0UL,_HighsCombinable<ThreadNeighbourhoodQueryData,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_mip_HighsCliqueTable_cpp:455:59)>::PaddedData_*,_false>
                               ._M_head_impl + -8 + lVar38),
                       *(undefined8 *)
                        ((long)local_98.threadCopies_._M_t.
                               super___uniq_ptr_impl<HighsCombinable<ThreadNeighbourhoodQueryData,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_mip_HighsCliqueTable_cpp:455:59)>::PaddedData,_highs::cache_aligned::Deleter<HighsCombinable<ThreadNeighbourhoodQueryData,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_mip_HighsCliqueTable_cpp:455:59)>::PaddedData[]>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_HighsCombinable<ThreadNeighbourhoodQueryData,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_mip_HighsCliqueTable_cpp:455:59)>::PaddedData_*,_highs::cache_aligned::Deleter<HighsCombinable<ThreadNeighbourhoodQueryData,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_mip_HighsCliqueTable_cpp:455:59)>::PaddedData[]>_>
                               .
                               super__Head_base<0UL,_HighsCombinable<ThreadNeighbourhoodQueryData,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_mip_HighsCliqueTable_cpp:455:59)>::PaddedData_*,_false>
                               ._M_head_impl + lVar38));
            *local_50 = *local_50 +
                        *(long *)((long)uVar30._M_t.
                                        super___uniq_ptr_impl<HighsCombinable<ThreadNeighbourhoodQueryData,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_mip_HighsCliqueTable_cpp:455:59)>::PaddedData,_highs::cache_aligned::Deleter<HighsCombinable<ThreadNeighbourhoodQueryData,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_mip_HighsCliqueTable_cpp:455:59)>::PaddedData[]>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_HighsCombinable<ThreadNeighbourhoodQueryData,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_mip_HighsCliqueTable_cpp:455:59)>::PaddedData_*,_highs::cache_aligned::Deleter<HighsCombinable<ThreadNeighbourhoodQueryData,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_mip_HighsCliqueTable_cpp:455:59)>::PaddedData[]>_>
                                        .
                                        super__Head_base<0UL,_HighsCombinable<ThreadNeighbourhoodQueryData,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_mip_HighsCliqueTable_cpp:455:59)>::PaddedData_*,_false>
                                        ._M_head_impl + -0x10 + lVar38);
            iVar33 = local_98.numThreads;
          }
          lVar39 = lVar39 + 1;
          lVar38 = lVar38 + 0x40;
        } while (lVar39 < iVar33);
      }
      piVar2 = (neighbourhoodInds->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      piVar4 = (neighbourhoodInds->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      if (piVar2 != piVar4) {
        uVar37 = (long)piVar4 - (long)piVar2 >> 2;
        iVar33 = 0;
        if (1 < uVar37) {
          iVar33 = 0;
          do {
            uVar37 = (long)uVar37 >> 1;
            iVar33 = iVar33 + 1;
          } while (1 < uVar37);
        }
        pdqsort_detail::
        pdqsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::less<int>,true>
                  (piVar2,piVar4,iVar33,1);
      }
      HighsCombinable<ThreadNeighbourhoodQueryData,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ERGO-Code[P]HiGHS/src/mip/HighsCliqueTable.cpp:455:59)>
      ::~HighsCombinable(&local_98);
    }
  }
  return;
}

Assistant:

void HighsCliqueTable::queryNeighbourhood(
    std::vector<HighsInt>& neighbourhoodInds, int64_t& numQueries, CliqueVar v,
    CliqueVar* q, HighsInt N) const {
  neighbourhoodInds.clear();

  if (numCliques(v) == 0) return;

  if (numEntries - sizeTwoCliques.size() * 2 < minEntriesForParallelism) {
    for (HighsInt i = 0; i < N; ++i) {
      if (haveCommonClique(numQueries, v, q[i])) neighbourhoodInds.push_back(i);
    }
  } else {
    auto neighbourhoodData =
        makeHighsCombinable<ThreadNeighbourhoodQueryData>([N]() {
          ThreadNeighbourhoodQueryData d;
          d.neighbourhoodInds.reserve(N);
          d.numQueries = 0;
          return d;
        });
    highs::parallel::for_each(
        0, N,
        [this, &neighbourhoodData, v, q](HighsInt start, HighsInt end) {
          ThreadNeighbourhoodQueryData& d = neighbourhoodData.local();
          for (HighsInt i = start; i < end; ++i) {
            if (haveCommonClique(d.numQueries, v, q[i]))
              d.neighbourhoodInds.push_back(i);
          }
        },
        10);

    neighbourhoodData.combine_each([&](ThreadNeighbourhoodQueryData& d) {
      neighbourhoodInds.insert(neighbourhoodInds.end(),
                               d.neighbourhoodInds.begin(),
                               d.neighbourhoodInds.end());
      numQueries += d.numQueries;
    });
    pdqsort(neighbourhoodInds.begin(), neighbourhoodInds.end());
  }
}